

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_mm_comp(jit_State *J,RecordIndex *ix,int op)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  uint in_EDX;
  jit_State *in_RSI;
  RecordIndex *in_RDI;
  MMS mm;
  RecordIndex *in_stack_00000020;
  jit_State *in_stack_00000028;
  uint local_8c;
  jit_State *in_stack_ffffffffffffff88;
  
  (in_RSI->cur).startpt.gcptr32 = (in_RSI->cur).startins;
  *(IRIns **)&in_RSI->cur = (in_RSI->cur).ir;
  local_8c = in_EDX;
  while( true ) {
    iVar3 = lj_record_mm_lookup(in_stack_00000028,in_stack_00000020,J._4_4_);
    if (iVar3 != 0) break;
    (in_RSI->cur).startpt.gcptr32 = (in_RSI->cur).startpc.ptr32;
    uVar1._0_4_ = (in_RSI->cur).nins;
    uVar1._4_4_ = (in_RSI->cur).gclist;
    (in_RSI->cur).nextgc = (GCRef)(undefined4)uVar1;
    (in_RSI->cur).marked = (char)((ulong)uVar1 >> 0x20);
    (in_RSI->cur).gct = (char)((ulong)uVar1 >> 0x28);
    (in_RSI->cur).topslot = (char)((ulong)uVar1 >> 0x30);
    (in_RSI->cur).linktype = (char)((ulong)uVar1 >> 0x38);
    iVar3 = lj_record_mm_lookup(in_stack_00000028,in_stack_00000020,J._4_4_);
    if (iVar3 != 0) break;
    if ((local_8c & 2) == 0) {
      return;
    }
    (in_RSI->cur).startpt.gcptr32 = (in_RSI->cur).startpc.ptr32;
    (in_RSI->cur).startpc.ptr32 = (in_RSI->cur).startins;
    (in_RSI->cur).startins = (in_RSI->cur).startpt.gcptr32;
    uVar2._0_4_ = (in_RSI->cur).nins;
    uVar2._4_4_ = (in_RSI->cur).gclist;
    (in_RSI->cur).nextgc = (GCRef)(undefined4)uVar2;
    (in_RSI->cur).marked = (char)((ulong)uVar2 >> 0x20);
    (in_RSI->cur).gct = (char)((ulong)uVar2 >> 0x28);
    (in_RSI->cur).topslot = (char)((ulong)uVar2 >> 0x30);
    (in_RSI->cur).linktype = (char)((ulong)uVar2 >> 0x38);
    *(IRIns **)&(in_RSI->cur).nins = (in_RSI->cur).ir;
    (in_RSI->cur).ir = *(IRIns **)&in_RSI->cur;
    local_8c = local_8c ^ 3;
    in_stack_ffffffffffffff88 = in_RSI;
  }
  rec_mm_callcomp(in_stack_ffffffffffffff88,in_RDI,(int)((ulong)in_RSI >> 0x20));
  return;
}

Assistant:

static void rec_mm_comp(jit_State *J, RecordIndex *ix, int op)
{
  ix->tab = ix->val;
  copyTV(J->L, &ix->tabv, &ix->valv);
  while (1) {
    MMS mm = (op & 2) ? MM_le : MM_lt;  /* Try __le + __lt or only __lt. */
#if LJ_52
    if (!lj_record_mm_lookup(J, ix, mm)) {  /* Lookup mm on 1st operand. */
      ix->tab = ix->key;
      copyTV(J->L, &ix->tabv, &ix->keyv);
      if (!lj_record_mm_lookup(J, ix, mm))  /* Lookup mm on 2nd operand. */
	goto nomatch;
    }
    rec_mm_callcomp(J, ix, op);
    return;
#else
    if (lj_record_mm_lookup(J, ix, mm)) {  /* Lookup mm on 1st operand. */
      cTValue *bv;
      TRef mo1 = ix->mobj;
      TValue mo1v;
      copyTV(J->L, &mo1v, &ix->mobjv);
      /* Avoid the 2nd lookup and the objcmp if the metatables are equal. */
      bv = &ix->keyv;
      if (tvistab(bv) && tabref(tabV(bv)->metatable) == ix->mtv) {
	TRef mt2 = emitir(IRT(IR_FLOAD, IRT_TAB), ix->key, IRFL_TAB_META);
	emitir(IRTG(IR_EQ, IRT_TAB), mt2, ix->mt);
      } else if (tvisudata(bv) && tabref(udataV(bv)->metatable) == ix->mtv) {
	TRef mt2 = emitir(IRT(IR_FLOAD, IRT_TAB), ix->key, IRFL_UDATA_META);
	emitir(IRTG(IR_EQ, IRT_TAB), mt2, ix->mt);
      } else {  /* Lookup metamethod on 2nd operand and compare both. */
	ix->tab = ix->key;
	copyTV(J->L, &ix->tabv, bv);
	if (!lj_record_mm_lookup(J, ix, mm) ||
	    lj_record_objcmp(J, mo1, ix->mobj, &mo1v, &ix->mobjv))
	  goto nomatch;
      }
      rec_mm_callcomp(J, ix, op);
      return;
    }
#endif
  nomatch:
    /* Lookup failed. Retry with  __lt and swapped operands. */
    if (!(op & 2)) break;  /* Already at __lt. Interpreter will throw. */
    ix->tab = ix->key; ix->key = ix->val; ix->val = ix->tab;
    copyTV(J->L, &ix->tabv, &ix->keyv);
    copyTV(J->L, &ix->keyv, &ix->valv);
    copyTV(J->L, &ix->valv, &ix->tabv);
    op ^= 3;
  }
}